

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O0

void amrex::WriteMultiLevelPlotfile
               (string *plotfilename,int nlevels,
               Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mf,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *geom,Real time,
               Vector<int,_std::allocator<int>_> *level_steps,
               Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *ref_ratio,
               string *versionName,string *levelPrefix,string *mfPrefix,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extra_dirs)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Long LVar5;
  MultiFab **ppMVar6;
  BoxArray *__args_4;
  MultiFab *dst;
  type pMVar7;
  int in_ESI;
  string *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  IntVect IVar8;
  string *in_stack_00000010;
  string *in_stack_00000018;
  string *in_stack_00000020;
  undefined8 in_stack_00000028;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> mf_tmp;
  MultiFab *data;
  int level_1;
  anon_class_264_11_18691074 f;
  int level;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> boxArrays;
  string ed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d;
  const_iterator __end2;
  const_iterator __begin2;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool callBarrier;
  int finest_level;
  undefined1 in_stack_00000bd3;
  How in_stack_00000bd4;
  string *in_stack_00000bd8;
  FabArray<amrex::FArrayBox> *in_stack_00000be0;
  BoxArray *in_stack_fffffffffffffc68;
  anon_class_264_11_18691074 *in_stack_fffffffffffffc70;
  anon_class_264_11_18691074 *in_stack_fffffffffffffc78;
  function<void_()> *in_stack_fffffffffffffc80;
  undefined1 *puVar9;
  char *in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  int *__args_2;
  string *in_stack_fffffffffffffcb0;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  string *in_stack_fffffffffffffcc0;
  undefined1 *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  undefined8 in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  string local_2b8 [32];
  int local_298 [14];
  int local_260 [3];
  undefined1 local_24c [64];
  int local_20c;
  string local_1e8 [32];
  int local_1c8;
  undefined1 in_stack_fffffffffffffe87;
  string *in_stack_fffffffffffffe88;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffe90;
  string local_140 [32];
  string local_120 [32];
  string local_100 [24];
  anon_class_264_11_18691074 *in_stack_ffffffffffffff18;
  int local_e0;
  string local_b0 [32];
  string local_90 [32];
  reference local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  undefined8 local_58;
  undefined1 local_4d;
  int local_4c;
  string *local_40;
  int local_1c;
  string *local_18;
  undefined4 local_c;
  string *local_8;
  
  local_40 = (string *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_4c = in_ESI + -1;
  local_4d = 0;
  local_1c = in_ESI;
  local_18 = in_RDI;
  PreBuildDirectorHierarchy
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
             (int)((ulong)in_stack_fffffffffffffce0 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffce0 >> 0x18,0));
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc80);
  if (!bVar2) {
    local_58 = in_stack_00000028;
    local_60._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffc68);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffc68);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffc70,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffc68), bVar2) {
      local_70 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_60);
      std::operator+(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
      std::operator+(&in_stack_fffffffffffffc78->plotfilename,
                     &in_stack_fffffffffffffc70->plotfilename);
      std::__cxx11::string::~string(local_b0);
      PreBuildDirectorHierarchy
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                 (int)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffce0 >> 0x18,0));
      std::__cxx11::string::~string(local_90);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_60);
    }
  }
  ParallelDescriptor::Barrier((string *)ParallelDescriptor::Unnamed_abi_cxx11_);
  iVar3 = ParallelDescriptor::MyProc();
  iVar4 = ParallelDescriptor::NProcs();
  if (iVar3 == iVar4 + -1) {
    std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x104b2d6);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68,
               (allocator_type *)0x104b2f3);
    std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x104b302);
    for (local_e0 = 0;
        LVar5 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::size
                          ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x104b32a),
        local_e0 < LVar5; local_e0 = local_e0 + 1) {
      ppMVar6 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                            *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
      FabArrayBase::boxArray((FabArrayBase *)*ppMVar6);
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
      BoxArray::operator=((BoxArray *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    }
    std::__cxx11::string::string(local_1e8,local_18);
    local_1c8 = local_1c;
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::Vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffffc70,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffffc68);
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc70,
             (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc68);
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::Vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_fffffffffffffc70,
               (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_fffffffffffffc68);
    Vector<int,_std::allocator<int>_>::Vector
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
               (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc68);
    Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::Vector
              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffffc70,
               (Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffffc68)
    ;
    std::__cxx11::string::string(local_140,in_stack_00000010);
    std::__cxx11::string::string(local_120,in_stack_00000018);
    std::__cxx11::string::string(local_100,in_stack_00000020);
    in_stack_fffffffffffffcd7 = AsyncOut::UseAsyncOut();
    if ((bool)in_stack_fffffffffffffcd7) {
      std::function<void()>::
      function<amrex::WriteMultiLevelPlotfile(std::__cxx11::string_const&,int,amrex::Vector<amrex::MultiFab_const*,std::allocator<amrex::MultiFab_const*>>const&,amrex::Vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,amrex::Vector<amrex::Geometry,std::allocator<amrex::Geometry>>const&,double,amrex::Vector<int,std::allocator<int>>const&,amrex::Vector<amrex::IntVect,std::allocator<amrex::IntVect>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,amrex::Vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0,void>
                (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      AsyncOut::Submit((function<void_()> *)0x104b529);
      std::function<void_()>::~function((function<void_()> *)0x104b538);
      in_stack_fffffffffffffe88 = local_40;
    }
    else {
      WriteMultiLevelPlotfile::anon_class_264_11_18691074::operator()(in_stack_ffffffffffffff18);
      in_stack_fffffffffffffe88 = local_40;
    }
    WriteMultiLevelPlotfile(std::__cxx11::string_const&,int,amrex::Vector<amrex::MultiFab_const*,std::allocator<amrex::MultiFab_const*>>const&,amrex::Vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,amrex::Vector<amrex::Geometry,std::allocator<amrex::Geometry>>const&,double,amrex::Vector<int,std::allocator<int>>const&,amrex::Vector<amrex::IntVect,std::allocator<amrex::IntVect>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,amrex::Vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
    ::$_0::~__0(in_stack_fffffffffffffc70);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x104b6d8);
  }
  for (local_20c = 0; local_20c <= local_4c; local_20c = local_20c + 1) {
    bVar2 = AsyncOut::UseAsyncOut();
    if (bVar2) {
      ppMVar6 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                            *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
      in_stack_fffffffffffffcc0 = (string *)*ppMVar6;
      in_stack_fffffffffffffcc8 = local_24c + 0x1c;
      MultiFabFileFullPrefix
                ((int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),in_stack_fffffffffffffcc0,
                 (string *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                 in_stack_fffffffffffffcb0);
      VisMF::AsyncWrite(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (bool)in_stack_fffffffffffffe87);
      std::__cxx11::string::~string((string *)(local_24c + 0x1c));
    }
    else {
      std::unique_ptr<amrex::MultiFab,std::default_delete<amrex::MultiFab>>::
      unique_ptr<std::default_delete<amrex::MultiFab>,void>
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffffc70);
      ppMVar6 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                            *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
      IVar8 = FabArrayBase::nGrowVect((FabArrayBase *)*ppMVar6);
      local_260._0_8_ = IVar8.vect._0_8_;
      local_24c._0_4_ = local_260[0];
      local_24c._4_4_ = local_260[1];
      uVar1 = local_24c._0_8_;
      local_260[2] = IVar8.vect[2];
      local_24c._8_4_ = local_260[2];
      in_stack_fffffffffffffcb0 = (string *)local_24c;
      local_c = 0;
      local_24c._0_4_ = IVar8.vect[0];
      in_stack_fffffffffffffcbf = true;
      if (local_24c._0_4_ == 0) {
        local_24c._4_4_ = IVar8.vect[1];
        in_stack_fffffffffffffcbf = true;
        if (local_24c._4_4_ == 0) {
          in_stack_fffffffffffffcbf = local_260[2] != 0;
        }
      }
      local_260 = IVar8.vect;
      local_24c._0_8_ = uVar1;
      local_8 = in_stack_fffffffffffffcb0;
      if ((bool)in_stack_fffffffffffffcbf == false) {
        ppMVar6 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                  operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                              *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        local_24c._20_8_ = *ppMVar6;
      }
      else {
        ppMVar6 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                  operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                              *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        __args_4 = FabArrayBase::boxArray((FabArrayBase *)*ppMVar6);
        ppMVar6 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                  operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                              *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        dst = (MultiFab *)FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar6);
        ppMVar6 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                  operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                              *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        local_298[0xb] = FabArrayBase::nComp((FabArrayBase *)*ppMVar6);
        local_298[10] = 0;
        local_298[4] = 0;
        local_298[5] = 0;
        local_298[6] = 0;
        local_298[7] = 0;
        local_298[0] = 0;
        local_298[1] = 0;
        local_298[2] = 0;
        local_298[3] = 0;
        local_298[8] = 0;
        local_298[9] = 0;
        __args_2 = local_298;
        MFInfo::MFInfo((MFInfo *)0x104b930);
        Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
                  ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                   in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        in_stack_fffffffffffffc68 =
             (BoxArray *)
             FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x104b94d);
        std::
        make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>const&>
                  ((BoxArray *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                   (DistributionMapping *)in_stack_fffffffffffffcb0,__args_2,(int *)dst,
                   (MFInfo *)__args_4,
                   (FabFactory<amrex::FArrayBox> *)
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        puVar9 = local_24c + 0xc;
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   in_stack_fffffffffffffc70,
                   (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   in_stack_fffffffffffffc68);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   in_stack_fffffffffffffc70);
        MFInfo::~MFInfo((MFInfo *)0x104b9ba);
        pMVar7 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                           ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                            in_stack_fffffffffffffc70);
        Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
                  ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                   in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        ppMVar6 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                  operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                              *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        FabArrayBase::nComp((FabArrayBase *)*ppMVar6);
        MultiFab::Copy(dst,(MultiFab *)__args_4,(int)((ulong)pMVar7 >> 0x20),(int)pMVar7,
                       (int)((ulong)puVar9 >> 0x20),(int)puVar9);
        local_24c._20_8_ =
             std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                       ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                        in_stack_fffffffffffffc70);
      }
      in_stack_fffffffffffffc70 = (anon_class_264_11_18691074 *)local_24c._20_8_;
      MultiFabFileFullPrefix
                ((int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),in_stack_fffffffffffffcc0,
                 (string *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                 in_stack_fffffffffffffcb0);
      VisMF::Write(in_stack_00000be0,in_stack_00000bd8,in_stack_00000bd4,(bool)in_stack_00000bd3);
      std::__cxx11::string::~string(local_2b8);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffffc70);
    }
  }
  return;
}

Assistant:

void
WriteMultiLevelPlotfile (const std::string& plotfilename, int nlevels,
                         const Vector<const MultiFab*>& mf,
                         const Vector<std::string>& varnames,
                         const Vector<Geometry>& geom, Real time,
                         const Vector<int>& level_steps,
                         const Vector<IntVect>& ref_ratio,
                         const std::string &versionName,
                         const std::string &levelPrefix,
                         const std::string &mfPrefix,
                         const Vector<std::string>& extra_dirs)
{
    BL_PROFILE("WriteMultiLevelPlotfile()");

    BL_ASSERT(nlevels <= mf.size());
    BL_ASSERT(nlevels <= geom.size());
    BL_ASSERT(nlevels <= ref_ratio.size()+1);
    BL_ASSERT(nlevels <= level_steps.size());
    BL_ASSERT(mf[0]->nComp() == varnames.size());

    int finest_level = nlevels-1;

    bool callBarrier(false);
    PreBuildDirectorHierarchy(plotfilename, levelPrefix, nlevels, callBarrier);
    if (!extra_dirs.empty()) {
        for (const auto& d : extra_dirs) {
            const std::string ed = plotfilename+"/"+d;
            amrex::PreBuildDirectorHierarchy(ed, levelPrefix, nlevels, callBarrier);
        }
    }
    ParallelDescriptor::Barrier();

    if (ParallelDescriptor::MyProc() == ParallelDescriptor::NProcs()-1) {
        Vector<BoxArray> boxArrays(nlevels);
        for(int level(0); level < boxArrays.size(); ++level) {
            boxArrays[level] = mf[level]->boxArray();
        }

        auto f = [=]() {
            VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);
            std::string HeaderFileName(plotfilename + "/Header");
            std::ofstream HeaderFile;
            HeaderFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
            HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                    std::ofstream::trunc |
                                                    std::ofstream::binary);
            if( ! HeaderFile.good()) FileOpenFailed(HeaderFileName);
            WriteGenericPlotfileHeader(HeaderFile, nlevels, boxArrays, varnames,
                                       geom, time, level_steps, ref_ratio, versionName,
                                       levelPrefix, mfPrefix);
        };

        if (AsyncOut::UseAsyncOut()) {
            AsyncOut::Submit(std::move(f));
        } else {
            f();
        }
    }

    for (int level = 0; level <= finest_level; ++level)
    {
        if (AsyncOut::UseAsyncOut()) {
            VisMF::AsyncWrite(*mf[level],
                              MultiFabFileFullPrefix(level, plotfilename, levelPrefix, mfPrefix),
                              true);
        } else {
            const MultiFab* data;
            std::unique_ptr<MultiFab> mf_tmp;
            if (mf[level]->nGrowVect() != 0) {
                mf_tmp = std::make_unique<MultiFab>(mf[level]->boxArray(),
                                                    mf[level]->DistributionMap(),
                                                    mf[level]->nComp(), 0, MFInfo(),
                                                    mf[level]->Factory());
                MultiFab::Copy(*mf_tmp, *mf[level], 0, 0, mf[level]->nComp(), 0);
                data = mf_tmp.get();
            } else {
                data = mf[level];
            }
            VisMF::Write(*data, MultiFabFileFullPrefix(level, plotfilename, levelPrefix, mfPrefix));
        }
    }
}